

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
alloc_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable)

{
  bool bVar1;
  uint uVar2;
  uint64_t *__s;
  uint64_t *puVar3;
  uint64_t *puVar4;
  size_t __n;
  bool bVar5;
  
  __s = (uint64_t *)part->chunk_table;
  if (__s != (uint64_t *)0x0) goto LAB_001241c9;
  __n = (long)part->chunk_count << 3;
  __s = (uint64_t *)(*ctxt->alloc_fn)(__n);
  if (__s == (uint64_t *)0x0) {
LAB_001241ad:
    uVar2 = (*ctxt->standard_error)(ctxt,1);
    puVar4 = (uint64_t *)(ulong)uVar2;
    bVar1 = false;
    __s = (uint64_t *)0x0;
  }
  else {
    memset(__s,0,__n);
    LOCK();
    puVar3 = (uint64_t *)part->chunk_table;
    bVar5 = puVar3 == (uint64_t *)0x0;
    if (bVar5) {
      part->chunk_table = (atomic_uintptr_t)__s;
      puVar3 = (uint64_t *)0x0;
    }
    UNLOCK();
    bVar1 = true;
    puVar4 = puVar3;
    if ((!bVar5) && (puVar4 = (uint64_t *)(*ctxt->free_fn)(__s), __s = puVar3, bVar5))
    goto LAB_001241ad;
  }
  if (!bVar1) {
    return (exr_result_t)puVar4;
  }
LAB_001241c9:
  *chunktable = __s;
  return 0;
}

Assistant:

static exr_result_t
alloc_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable)
{
    uint64_t* ctable = NULL;

    /* we have the lock, but to access the type, we'll use the atomic function anyway */
#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif

    if (ctable == NULL)
    {
        uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;
        uintptr_t eptr = 0, nptr = 0;

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (ctable, 0, chunkbytes);

        nptr = (uintptr_t) ctable;
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }
    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}